

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  BeginString local_78;
  string *local_18;
  string *beginString_local;
  DataDictionary *this_local;
  
  local_18 = beginString;
  beginString_local = (string *)this;
  BeginString::BeginString(&local_78,beginString);
  BeginString::operator=((BeginString *)(this + 0x10),&local_78);
  BeginString::~BeginString(&local_78);
  this[8] = (DataDictionary)0x1;
  return;
}

Assistant:

void setVersion( const std::string& beginString )
  {
    m_beginString = beginString;
    m_hasVersion = true;
  }